

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::SubdivPatch1MBIntersectorK<4>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  GridSOA *pGVar1;
  GridSOA *pGVar2;
  GridSOA *pGVar3;
  GridSOA *pGVar4;
  GridSOA *pGVar5;
  GridSOA *pGVar6;
  float *pfVar7;
  GridSOA *pGVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  int iVar18;
  float fVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  uint uVar23;
  uint uVar24;
  GridSOA *pGVar25;
  Geometry *pGVar26;
  RTCFilterFunctionN p_Var27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ulong uVar39;
  GridSOA *pGVar40;
  size_t sVar41;
  ulong uVar42;
  int iVar43;
  uint uVar44;
  ulong uVar45;
  ulong uVar46;
  undefined4 uVar47;
  ulong unaff_RBP;
  size_t mask;
  ulong uVar48;
  long lVar49;
  ulong uVar50;
  GridSOA *pGVar51;
  GridSOA *pGVar52;
  GridSOA *pGVar53;
  GridSOA *pGVar54;
  NodeRef *pNVar55;
  ulong uVar56;
  bool bVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar75;
  float fVar76;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar77;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar82;
  float fVar95;
  float fVar96;
  undefined1 in_XMM1 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar97;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar98;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  float fVar106;
  float fVar107;
  uint uVar108;
  undefined1 auVar109 [12];
  undefined1 auVar110 [12];
  float fVar118;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar119;
  uint uVar120;
  float fVar121;
  float fVar122;
  uint uVar123;
  float fVar124;
  float fVar125;
  uint uVar126;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [12];
  undefined1 auVar130 [12];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar152;
  float fVar154;
  undefined1 auVar150 [16];
  float fVar153;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar151 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar180;
  undefined1 auVar178 [16];
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar179 [16];
  ulong local_b78;
  undefined8 local_af8;
  undefined4 uStack_a4c;
  undefined1 local_a48 [16];
  Precalculations *local_a30;
  undefined8 local_a28;
  float fStack_a20;
  float fStack_a1c;
  GridSOA *local_a10;
  ulong local_a08;
  ulong local_a00;
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  undefined1 (*local_9e0) [12];
  RTCFilterFunctionNArguments args;
  float local_958 [4];
  float local_948 [4];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [8];
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  NodeRef *local_8a0;
  undefined4 local_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  undefined1 local_858 [16];
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  uint local_828;
  uint uStack_824;
  uint uStack_820;
  uint uStack_81c;
  uint local_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  NodeRef stack [244];
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  
  stack[0] = root;
  fVar12 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar13 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar14 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar15 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar16 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar17 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar48 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar56 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar18 = (tray->tnear).field_0.i[k];
  auVar150._4_4_ = iVar18;
  auVar150._0_4_ = iVar18;
  auVar150._8_4_ = iVar18;
  auVar150._12_4_ = iVar18;
  iVar18 = (tray->tfar).field_0.i[k];
  local_9e0 = (undefined1 (*) [12])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  pNVar55 = stack + 1;
  local_a30 = pre;
  do {
    local_8a0 = pNVar55;
    if (local_8a0 == stack) break;
    pNVar55 = local_8a0 + -1;
    uVar39 = local_8a0[-1].ptr;
    do {
      if ((uVar39 & 8) == 0) {
        uVar42 = uVar39 & 0xfffffffffffffff0;
        fVar58 = *(float *)(ray + k * 4 + 0x70);
        pfVar9 = (float *)(uVar42 + 0x80 + uVar48);
        pfVar7 = (float *)(uVar42 + 0x20 + uVar48);
        auVar83._0_4_ = ((*pfVar9 * fVar58 + *pfVar7) - fVar12) * fVar15;
        auVar83._4_4_ = ((pfVar9[1] * fVar58 + pfVar7[1]) - fVar12) * fVar15;
        auVar83._8_4_ = ((pfVar9[2] * fVar58 + pfVar7[2]) - fVar12) * fVar15;
        auVar83._12_4_ = ((pfVar9[3] * fVar58 + pfVar7[3]) - fVar12) * fVar15;
        pfVar9 = (float *)(uVar42 + 0x80 + uVar46);
        pfVar7 = (float *)(uVar42 + 0x20 + uVar46);
        auVar83 = maxps(auVar150,auVar83);
        auVar93._0_4_ = ((*pfVar9 * fVar58 + *pfVar7) - fVar13) * fVar16;
        auVar93._4_4_ = ((pfVar9[1] * fVar58 + pfVar7[1]) - fVar13) * fVar16;
        auVar93._8_4_ = ((pfVar9[2] * fVar58 + pfVar7[2]) - fVar13) * fVar16;
        auVar93._12_4_ = ((pfVar9[3] * fVar58 + pfVar7[3]) - fVar13) * fVar16;
        pfVar9 = (float *)(uVar42 + 0x80 + uVar56);
        pfVar7 = (float *)(uVar42 + 0x20 + uVar56);
        auVar111._0_4_ = ((*pfVar9 * fVar58 + *pfVar7) - fVar14) * fVar17;
        auVar111._4_4_ = ((pfVar9[1] * fVar58 + pfVar7[1]) - fVar14) * fVar17;
        auVar111._8_4_ = ((pfVar9[2] * fVar58 + pfVar7[2]) - fVar14) * fVar17;
        auVar111._12_4_ = ((pfVar9[3] * fVar58 + pfVar7[3]) - fVar14) * fVar17;
        auVar111 = maxps(auVar93,auVar111);
        auVar83 = maxps(auVar83,auVar111);
        pfVar9 = (float *)(uVar42 + 0x80 + (uVar48 ^ 0x10));
        pfVar7 = (float *)(uVar42 + 0x20 + (uVar48 ^ 0x10));
        auVar112._0_4_ = ((*pfVar9 * fVar58 + *pfVar7) - fVar12) * fVar15;
        auVar112._4_4_ = ((pfVar9[1] * fVar58 + pfVar7[1]) - fVar12) * fVar15;
        auVar112._8_4_ = ((pfVar9[2] * fVar58 + pfVar7[2]) - fVar12) * fVar15;
        auVar112._12_4_ = ((pfVar9[3] * fVar58 + pfVar7[3]) - fVar12) * fVar15;
        auVar114._4_4_ = iVar18;
        auVar114._0_4_ = iVar18;
        auVar114._8_4_ = iVar18;
        auVar114._12_4_ = iVar18;
        auVar111 = minps(auVar114,auVar112);
        pfVar10 = (float *)(uVar42 + 0x80 + (uVar46 ^ 0x10));
        pfVar7 = (float *)(uVar42 + 0x20 + (uVar46 ^ 0x10));
        pfVar11 = (float *)(uVar42 + 0x80 + (uVar56 ^ 0x10));
        pfVar9 = (float *)(uVar42 + 0x20 + (uVar56 ^ 0x10));
        auVar113._0_4_ = ((*pfVar10 * fVar58 + *pfVar7) - fVar13) * fVar16;
        auVar113._4_4_ = ((pfVar10[1] * fVar58 + pfVar7[1]) - fVar13) * fVar16;
        auVar113._8_4_ = ((pfVar10[2] * fVar58 + pfVar7[2]) - fVar13) * fVar16;
        auVar113._12_4_ = ((pfVar10[3] * fVar58 + pfVar7[3]) - fVar13) * fVar16;
        auVar127._0_4_ = ((*pfVar11 * fVar58 + *pfVar9) - fVar14) * fVar17;
        auVar127._4_4_ = ((pfVar11[1] * fVar58 + pfVar9[1]) - fVar14) * fVar17;
        auVar127._8_4_ = ((pfVar11[2] * fVar58 + pfVar9[2]) - fVar14) * fVar17;
        auVar127._12_4_ = ((pfVar11[3] * fVar58 + pfVar9[3]) - fVar14) * fVar17;
        auVar114 = minps(auVar113,auVar127);
        auVar111 = minps(auVar111,auVar114);
        bVar57 = auVar83._0_4_ <= auVar111._0_4_;
        bVar28 = auVar83._4_4_ <= auVar111._4_4_;
        bVar29 = auVar83._8_4_ <= auVar111._8_4_;
        bVar30 = auVar83._12_4_ <= auVar111._12_4_;
        if (((uint)uVar39 & 7) == 6) {
          bVar57 = (fVar58 < *(float *)(uVar42 + 0xf0) && *(float *)(uVar42 + 0xe0) <= fVar58) &&
                   bVar57;
          bVar28 = (fVar58 < *(float *)(uVar42 + 0xf4) && *(float *)(uVar42 + 0xe4) <= fVar58) &&
                   bVar28;
          bVar29 = (fVar58 < *(float *)(uVar42 + 0xf8) && *(float *)(uVar42 + 0xe8) <= fVar58) &&
                   bVar29;
          bVar30 = (fVar58 < *(float *)(uVar42 + 0xfc) && *(float *)(uVar42 + 0xec) <= fVar58) &&
                   bVar30;
        }
        in_XMM1._0_4_ = (uint)bVar57 * -0x80000000;
        in_XMM1._4_4_ = (uint)bVar28 * -0x80000000;
        in_XMM1._8_4_ = (float)((uint)bVar29 * -0x80000000);
        in_XMM1._12_4_ = (float)((uint)bVar30 * -0x80000000);
        uVar47 = movmskps((int)unaff_RBP,in_XMM1);
        unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),uVar47);
      }
      if ((uVar39 & 8) == 0) {
        if (unaff_RBP == 0) {
          uVar44 = 4;
        }
        else {
          uVar42 = uVar39 & 0xfffffffffffffff0;
          lVar49 = 0;
          if (unaff_RBP != 0) {
            for (; (unaff_RBP >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
            }
          }
          uVar44 = 0;
          uVar39 = *(ulong *)(uVar42 + lVar49 * 8);
          uVar50 = unaff_RBP - 1 & unaff_RBP;
          if (uVar50 != 0) {
            pNVar55->ptr = uVar39;
            lVar49 = 0;
            if (uVar50 != 0) {
              for (; (uVar50 >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
              }
            }
            uVar45 = uVar50 - 1;
            while( true ) {
              pNVar55 = pNVar55 + 1;
              uVar39 = *(ulong *)(uVar42 + lVar49 * 8);
              uVar45 = uVar45 & uVar50;
              if (uVar45 == 0) break;
              pNVar55->ptr = uVar39;
              lVar49 = 0;
              if (uVar45 != 0) {
                for (; (uVar45 >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
                }
              }
              uVar50 = uVar45 - 1;
            }
          }
        }
      }
      else {
        uVar44 = 6;
      }
    } while (uVar44 == 0);
    if (uVar44 == 6) {
      if (((uint)uVar39 & 0xf) == 8) {
        pGVar25 = (local_a30->super_Precalculations).grid;
        local_9f8 = *(float *)(ray + k * 4 + 0x70) * (float)(*(int *)(pGVar25 + 8) - 1);
        auVar84 = roundss(in_XMM1,ZEXT416((uint)local_9f8),9);
        fVar58 = (float)(*(int *)(pGVar25 + 8) - 1) + -1.0;
        if (fVar58 <= auVar84._0_4_) {
          auVar84._0_4_ = fVar58;
        }
        fVar58 = 0.0;
        if (0.0 <= auVar84._0_4_) {
          fVar58 = auVar84._0_4_;
        }
        uVar44 = *(uint *)(pGVar25 + 0xc);
        lVar49 = (long)(int)fVar58 * (ulong)*(uint *)(pGVar25 + 0x28) +
                 (ulong)*(uint *)(pGVar25 + 0x24);
        uVar39 = uVar39 >> 4;
        local_a28 = pGVar25 + uVar39 * 4 + lVar49;
        pGVar40 = pGVar25 + uVar39 * 4 + lVar49 + 0x2c;
        fVar77 = *(float *)(pGVar40 + 4);
        pGVar8 = local_a28 + (ulong)uVar44 * 4 + 0x2c;
        fVar60 = *(float *)(pGVar8 + 4);
        fVar76 = *(float *)(pGVar40 + 8);
        fVar79 = *(float *)(pGVar8 + 8);
        if ((ulong)uVar44 == 2) {
          fVar76 = fVar77;
          fVar79 = fVar60;
        }
        uVar42 = (ulong)*(uint *)(pGVar25 + 0x14);
        pGVar53 = local_a28 + uVar42 * 4 + 0x2c;
        fVar81 = *(float *)(local_a28 + uVar42 * 4 + 0x30);
        pGVar1 = pGVar53 + (ulong)uVar44 * 4;
        fVar142 = *(float *)(pGVar1 + 4);
        fVar158 = *(float *)(pGVar1 + 8);
        fVar107 = *(float *)(local_a28 + uVar42 * 4 + 0x34);
        if ((ulong)uVar44 == 2) {
          fVar158 = fVar142;
          fVar107 = fVar81;
        }
        pGVar51 = local_a28 + uVar42 * 8 + 0x2c;
        fVar119 = *(float *)(local_a28 + uVar42 * 8 + 0x30);
        pGVar2 = pGVar51 + (ulong)uVar44 * 4;
        fVar122 = *(float *)(pGVar2 + 4);
        fVar125 = *(float *)(pGVar2 + 8);
        fVar136 = *(float *)(local_a28 + uVar42 * 8 + 0x34);
        if ((ulong)uVar44 == 2) {
          fVar125 = fVar122;
          fVar136 = fVar119;
        }
        lVar49 = uVar39 * 4 + lVar49 + 0x2c;
        uVar39 = (ulong)(*(uint *)(pGVar25 + 0x28) & 0xfffffffc);
        pGVar3 = pGVar25 + uVar39 + lVar49;
        fVar106 = *(float *)(pGVar3 + 4);
        pGVar4 = pGVar25 + (ulong)uVar44 * 4 + uVar39 + lVar49;
        fVar137 = *(float *)(pGVar4 + 4);
        fVar118 = *(float *)(pGVar3 + 8);
        fVar138 = *(float *)(pGVar4 + 8);
        if ((ulong)uVar44 == 2) {
          fVar118 = fVar106;
          fVar138 = fVar137;
        }
        pGVar54 = pGVar53 + uVar39;
        fVar121 = *(float *)(pGVar54 + 4);
        pGVar5 = pGVar54 + (ulong)uVar44 * 4;
        fVar139 = *(float *)(pGVar5 + 4);
        fVar124 = *(float *)(pGVar54 + 8);
        fVar149 = *(float *)(pGVar5 + 8);
        if ((ulong)uVar44 == 2) {
          fVar124 = fVar121;
          fVar149 = fVar139;
        }
        local_9f8 = local_9f8 - fVar58;
        pGVar52 = pGVar51 + uVar39;
        fVar58 = *(float *)(pGVar52 + 4);
        pGVar6 = pGVar52 + (ulong)uVar44 * 4;
        fVar153 = *(float *)(pGVar6 + 4);
        fVar140 = *(float *)(pGVar52 + 8);
        fVar155 = *(float *)(pGVar6 + 8);
        if ((ulong)uVar44 == 2) {
          fVar140 = fVar58;
          fVar155 = fVar153;
        }
        uVar23 = *(uint *)(pGVar25 + 0x10);
        local_a10 = local_a28 + uVar42 * 0xc + 0x2c;
        local_808 = 1.0 - local_9f8;
        fStack_804 = local_808;
        fStack_800 = local_808;
        fStack_7fc = local_808;
        local_a08 = (ulong)uVar44;
        uVar24 = *(uint *)(pGVar25 + 0x18);
        uVar47 = *(undefined4 *)(pGVar25 + 0x1c);
        fVar147 = *(float *)(ray + k * 4);
        fVar143 = *(float *)(ray + k * 4 + 0x10);
        fVar161 = *(float *)(ray + k * 4 + 0x20);
        fVar19 = *(float *)(ray + k * 4 + 0x40);
        fVar98 = (*(float *)pGVar40 * local_808 + *(float *)pGVar3 * local_9f8) - fVar147;
        fVar103 = (*(float *)pGVar8 * local_808 + *(float *)pGVar4 * local_9f8) - fVar147;
        fVar104 = (fVar77 * local_808 + fVar106 * local_9f8) - fVar147;
        fVar105 = (fVar60 * local_808 + fVar137 * local_9f8) - fVar147;
        fVar82 = (*(float *)pGVar53 * local_808 + *(float *)pGVar54 * local_9f8) - fVar143;
        fVar95 = (*(float *)pGVar1 * local_808 + *(float *)pGVar5 * local_9f8) - fVar143;
        fVar96 = (fVar81 * local_808 + fVar121 * local_9f8) - fVar143;
        fVar97 = (fVar142 * local_808 + fVar139 * local_9f8) - fVar143;
        fVar59 = (*(float *)pGVar51 * local_808 + *(float *)pGVar52 * local_9f8) - fVar161;
        fVar75 = (*(float *)pGVar2 * local_808 + *(float *)pGVar6 * local_9f8) - fVar161;
        fVar78 = (fVar119 * local_808 + fVar58 * local_9f8) - fVar161;
        fVar80 = (fVar122 * local_808 + fVar153 * local_9f8) - fVar161;
        fVar162 = (fVar77 * local_808 + fVar106 * local_9f8) - fVar147;
        fVar167 = (fVar77 * local_808 + fVar106 * local_9f8) - fVar147;
        fVar170 = (fVar76 * local_808 + fVar118 * local_9f8) - fVar147;
        fVar173 = (fVar76 * local_808 + fVar118 * local_9f8) - fVar147;
        fVar106 = (fVar81 * local_808 + fVar121 * local_9f8) - fVar143;
        fVar118 = (fVar81 * local_808 + fVar121 * local_9f8) - fVar143;
        fVar121 = (fVar107 * local_808 + fVar124 * local_9f8) - fVar143;
        fVar124 = (fVar107 * local_808 + fVar124 * local_9f8) - fVar143;
        fVar148 = (fVar119 * local_808 + fVar58 * local_9f8) - fVar161;
        fVar152 = (fVar119 * local_808 + fVar58 * local_9f8) - fVar161;
        fVar154 = (fVar136 * local_808 + fVar140 * local_9f8) - fVar161;
        fVar156 = (fVar136 * local_808 + fVar140 * local_9f8) - fVar161;
        fVar144 = (*(float *)pGVar8 * local_808 + *(float *)pGVar4 * local_9f8) - fVar147;
        fVar145 = (fVar60 * local_808 + fVar137 * local_9f8) - fVar147;
        fVar146 = (fVar60 * local_808 + fVar137 * local_9f8) - fVar147;
        fVar147 = (fVar79 * local_808 + fVar138 * local_9f8) - fVar147;
        fVar140 = (*(float *)pGVar1 * local_808 + *(float *)pGVar5 * local_9f8) - fVar143;
        fVar141 = (fVar142 * local_808 + fVar139 * local_9f8) - fVar143;
        fVar142 = (fVar142 * local_808 + fVar139 * local_9f8) - fVar143;
        fVar143 = (fVar158 * local_808 + fVar149 * local_9f8) - fVar143;
        fVar158 = (*(float *)pGVar2 * local_808 + *(float *)pGVar6 * local_9f8) - fVar161;
        fVar159 = (fVar122 * local_808 + fVar153 * local_9f8) - fVar161;
        fVar160 = (fVar122 * local_808 + fVar153 * local_9f8) - fVar161;
        fVar161 = (fVar125 * local_808 + fVar155 * local_9f8) - fVar161;
        fVar163 = fVar144 - fVar98;
        fVar168 = fVar145 - fVar103;
        fVar171 = fVar146 - fVar104;
        fVar174 = fVar147 - fVar105;
        local_8c8 = fVar140 - fVar82;
        fStack_8c4 = fVar141 - fVar95;
        fStack_8c0 = fVar142 - fVar96;
        fStack_8bc = fVar143 - fVar97;
        local_8b8 = fVar158 - fVar59;
        fStack_8b4 = fVar159 - fVar75;
        fStack_8b0 = fVar160 - fVar78;
        fStack_8ac = fVar161 - fVar80;
        fVar58 = *(float *)(ray + k * 4 + 0x50);
        fVar77 = *(float *)(ray + k * 4 + 0x60);
        fVar107 = fVar98 - fVar162;
        fVar119 = fVar103 - fVar167;
        fVar122 = fVar104 - fVar170;
        fVar125 = fVar105 - fVar173;
        local_8f8 = (local_8c8 * (fVar158 + fVar59) - (fVar140 + fVar82) * local_8b8) * fVar19 +
                    ((fVar144 + fVar98) * local_8b8 - (fVar158 + fVar59) * fVar163) * fVar58 +
                    (fVar163 * (fVar140 + fVar82) - (fVar144 + fVar98) * local_8c8) * fVar77;
        fStack_8f4 = (fStack_8c4 * (fVar159 + fVar75) - (fVar141 + fVar95) * fStack_8b4) * fVar19 +
                     ((fVar145 + fVar103) * fStack_8b4 - (fVar159 + fVar75) * fVar168) * fVar58 +
                     (fVar168 * (fVar141 + fVar95) - (fVar145 + fVar103) * fStack_8c4) * fVar77;
        fStack_8f0 = (fStack_8c0 * (fVar160 + fVar78) - (fVar142 + fVar96) * fStack_8b0) * fVar19 +
                     ((fVar146 + fVar104) * fStack_8b0 - (fVar160 + fVar78) * fVar171) * fVar58 +
                     (fVar171 * (fVar142 + fVar96) - (fVar146 + fVar104) * fStack_8c0) * fVar77;
        fStack_8ec = (fStack_8bc * (fVar161 + fVar80) - (fVar143 + fVar97) * fStack_8ac) * fVar19 +
                     ((fVar147 + fVar105) * fStack_8ac - (fVar161 + fVar80) * fVar174) * fVar58 +
                     (fVar174 * (fVar143 + fVar97) - (fVar147 + fVar105) * fStack_8bc) * fVar77;
        fVar149 = fVar82 - fVar106;
        fVar153 = fVar95 - fVar118;
        fVar155 = fVar96 - fVar121;
        fVar157 = fVar97 - fVar124;
        local_8d8._0_4_ = fVar59 - fVar148;
        local_8d8._4_4_ = fVar75 - fVar152;
        fStack_8d0 = fVar78 - fVar154;
        fStack_8cc = fVar80 - fVar156;
        fVar60 = (fVar149 * (fVar59 + fVar148) - (fVar82 + fVar106) * (float)local_8d8._0_4_) *
                 fVar19 + ((fVar98 + fVar162) * (float)local_8d8._0_4_ -
                          (fVar59 + fVar148) * fVar107) * fVar58 +
                          (fVar107 * (fVar82 + fVar106) - (fVar98 + fVar162) * fVar149) * fVar77;
        fVar76 = (fVar153 * (fVar75 + fVar152) - (fVar95 + fVar118) * (float)local_8d8._4_4_) *
                 fVar19 + ((fVar103 + fVar167) * (float)local_8d8._4_4_ -
                          (fVar75 + fVar152) * fVar119) * fVar58 +
                          (fVar119 * (fVar95 + fVar118) - (fVar103 + fVar167) * fVar153) * fVar77;
        local_7f8._4_4_ = fVar76;
        local_7f8._0_4_ = fVar60;
        fVar79 = (fVar155 * (fVar78 + fVar154) - (fVar96 + fVar121) * fStack_8d0) * fVar19 +
                 ((fVar104 + fVar170) * fStack_8d0 - (fVar78 + fVar154) * fVar122) * fVar58 +
                 (fVar122 * (fVar96 + fVar121) - (fVar104 + fVar170) * fVar155) * fVar77;
        fVar81 = (fVar157 * (fVar80 + fVar156) - (fVar97 + fVar124) * fStack_8cc) * fVar19 +
                 ((fVar105 + fVar173) * fStack_8cc - (fVar80 + fVar156) * fVar125) * fVar58 +
                 (fVar125 * (fVar97 + fVar124) - (fVar105 + fVar173) * fVar157) * fVar77;
        fVar164 = fVar162 - fVar144;
        fVar169 = fVar167 - fVar145;
        fVar172 = fVar170 - fVar146;
        fVar175 = fVar173 - fVar147;
        fVar136 = fVar106 - fVar140;
        fVar137 = fVar118 - fVar141;
        fVar138 = fVar121 - fVar142;
        fVar139 = fVar124 - fVar143;
        local_8e8._0_4_ = fVar148 - fVar158;
        local_8e8._4_4_ = fVar152 - fVar159;
        local_8e8._8_4_ = fVar154 - fVar160;
        local_8e8._12_4_ = fVar156 - fVar161;
        local_7f8._8_4_ = fVar79;
        local_7f8._12_4_ = fVar81;
        auVar85._0_4_ =
             (fVar136 * (fVar158 + fVar148) - (fVar140 + fVar106) * local_8e8._0_4_) * fVar19 +
             ((fVar144 + fVar162) * local_8e8._0_4_ - (fVar158 + fVar148) * fVar164) * fVar58 +
             (fVar164 * (fVar140 + fVar106) - (fVar144 + fVar162) * fVar136) * fVar77;
        auVar85._4_4_ =
             (fVar137 * (fVar159 + fVar152) - (fVar141 + fVar118) * local_8e8._4_4_) * fVar19 +
             ((fVar145 + fVar167) * local_8e8._4_4_ - (fVar159 + fVar152) * fVar169) * fVar58 +
             (fVar169 * (fVar141 + fVar118) - (fVar145 + fVar167) * fVar137) * fVar77;
        auVar85._8_4_ =
             (fVar138 * (fVar160 + fVar154) - (fVar142 + fVar121) * local_8e8._8_4_) * fVar19 +
             ((fVar146 + fVar170) * local_8e8._8_4_ - (fVar160 + fVar154) * fVar172) * fVar58 +
             (fVar172 * (fVar142 + fVar121) - (fVar146 + fVar170) * fVar138) * fVar77;
        auVar85._12_4_ =
             (fVar139 * (fVar161 + fVar156) - (fVar143 + fVar124) * local_8e8._12_4_) * fVar19 +
             ((fVar147 + fVar173) * local_8e8._12_4_ - (fVar161 + fVar156) * fVar175) * fVar58 +
             (fVar175 * (fVar143 + fVar124) - (fVar147 + fVar173) * fVar139) * fVar77;
        local_7e8._0_4_ = local_8f8 + fVar60 + auVar85._0_4_;
        local_7e8._4_4_ = fStack_8f4 + fVar76 + auVar85._4_4_;
        local_7e8._8_4_ = fStack_8f0 + fVar79 + auVar85._8_4_;
        local_7e8._12_4_ = fStack_8ec + fVar81 + auVar85._12_4_;
        auVar61._4_4_ = fStack_8f4;
        auVar61._0_4_ = local_8f8;
        auVar61._8_4_ = fStack_8f0;
        auVar61._12_4_ = fStack_8ec;
        auVar83 = minps(auVar61,local_7f8);
        auVar83 = minps(auVar83,auVar85);
        auVar133._4_4_ = fStack_8f4;
        auVar133._0_4_ = local_8f8;
        auVar133._8_4_ = fStack_8f0;
        auVar133._12_4_ = fStack_8ec;
        auVar111 = maxps(auVar133,local_7f8);
        auVar111 = maxps(auVar111,auVar85);
        fVar142 = ABS(local_7e8._0_4_) * 1.1920929e-07;
        fVar158 = ABS(local_7e8._4_4_) * 1.1920929e-07;
        auVar134._4_4_ = -(uint)(auVar111._4_4_ <= fVar158);
        auVar134._0_4_ = -(uint)(auVar111._0_4_ <= fVar142);
        auVar134._8_4_ = -(uint)(auVar111._8_4_ <= ABS(local_7e8._8_4_) * 1.1920929e-07);
        auVar134._12_4_ = -(uint)(auVar111._12_4_ <= ABS(local_7e8._12_4_) * 1.1920929e-07);
        in_XMM1._0_8_ = CONCAT44(fVar158,fVar142) ^ 0x8000000080000000;
        in_XMM1._8_4_ = -(ABS(local_7e8._8_4_) * 1.1920929e-07);
        in_XMM1._12_4_ = -(ABS(local_7e8._12_4_) * 1.1920929e-07);
        auVar62._4_4_ = -(uint)(-fVar158 <= auVar83._4_4_);
        auVar62._0_4_ = -(uint)(-fVar142 <= auVar83._0_4_);
        auVar62._8_4_ = -(uint)(in_XMM1._8_4_ <= auVar83._8_4_);
        auVar62._12_4_ = -(uint)(in_XMM1._12_4_ <= auVar83._12_4_);
        auVar134 = auVar134 | auVar62;
        iVar43 = movmskps((int)&local_a10,auVar134);
        fStack_9f4 = local_9f8;
        fStack_9f0 = local_9f8;
        fStack_9ec = local_9f8;
        if (iVar43 == 0) {
LAB_002aae71:
          auVar176._4_4_ = local_9f8;
          auVar176._0_4_ = local_9f8;
          auVar176._8_4_ = local_9f8;
          auVar176._12_4_ = local_9f8;
LAB_002aaea7:
          if (2 < uVar23) {
            uVar39 = (ulong)uVar44;
            pGVar40 = local_a28 + uVar39 * 4 + 0x2c;
            fVar58 = *(float *)(local_a28 + uVar39 * 4 + 0x30);
            pGVar25 = pGVar40 + uVar39 * 4;
            fVar77 = *(float *)(pGVar25 + 4);
            fVar60 = *(float *)(local_a28 + uVar39 * 4 + 0x34);
            fVar76 = *(float *)(pGVar25 + 8);
            if (uVar39 == 2) {
              fVar60 = fVar58;
              fVar76 = fVar77;
            }
            pGVar53 = (local_a30->super_Precalculations).grid;
            uVar39 = (ulong)*(uint *)(pGVar53 + 0x14);
            pGVar8 = pGVar40 + uVar39 * 4;
            fVar79 = *(float *)(pGVar8 + 4);
            pGVar1 = pGVar8 + (ulong)uVar44 * 4;
            fVar81 = *(float *)(pGVar1 + 4);
            fVar142 = *(float *)(pGVar8 + 8);
            fVar158 = *(float *)(pGVar1 + 8);
            if ((ulong)uVar44 == 2) {
              fVar142 = fVar79;
              fVar158 = fVar81;
            }
            pGVar2 = pGVar40 + uVar39 * 8;
            fVar107 = *(float *)(pGVar2 + 4);
            pGVar51 = pGVar2 + (ulong)uVar44 * 4;
            fVar119 = *(float *)(pGVar51 + 4);
            fVar122 = *(float *)(pGVar51 + 8);
            fVar125 = *(float *)(pGVar2 + 8);
            if ((ulong)uVar44 == 2) {
              fVar122 = fVar119;
              fVar125 = fVar107;
            }
            uVar42 = (ulong)(*(uint *)(pGVar53 + 0x28) & 0xfffffffc);
            pGVar3 = pGVar40 + uVar42;
            fVar136 = *(float *)(pGVar3 + 4);
            pGVar4 = pGVar40 + (ulong)uVar44 * 4 + uVar42;
            fVar106 = *(float *)(pGVar4 + 4);
            fVar137 = *(float *)(pGVar3 + 8);
            fVar118 = *(float *)(pGVar4 + 8);
            if ((ulong)uVar44 == 2) {
              fVar137 = fVar136;
              fVar118 = fVar106;
            }
            pGVar54 = pGVar8 + uVar42;
            fVar138 = *(float *)(pGVar54 + 4);
            pGVar5 = pGVar54 + (ulong)uVar44 * 4;
            fVar121 = *(float *)(pGVar5 + 4);
            fVar139 = *(float *)(pGVar54 + 8);
            fVar124 = *(float *)(pGVar5 + 8);
            if ((ulong)uVar44 == 2) {
              fVar139 = fVar138;
              fVar124 = fVar121;
            }
            pGVar52 = pGVar2 + uVar42;
            fVar149 = *(float *)(pGVar52 + 4);
            pGVar6 = pGVar52 + (ulong)uVar44 * 4;
            fVar153 = *(float *)(pGVar6 + 4);
            fVar140 = *(float *)(pGVar6 + 8);
            fVar155 = *(float *)(pGVar52 + 8);
            if ((ulong)uVar44 == 2) {
              fVar140 = fVar153;
              fVar155 = fVar149;
            }
            local_a10 = pGVar40 + uVar39 * 0xc;
            fVar103 = auVar176._0_4_;
            fVar105 = auVar176._4_4_;
            fVar141 = auVar176._8_4_;
            fVar144 = auVar176._12_4_;
            local_a08 = (ulong)uVar44;
            uVar24 = *(uint *)(pGVar53 + 0x18);
            uVar47 = *(undefined4 *)(pGVar53 + 0x1c);
            fVar147 = *(float *)(ray + k * 4);
            fVar143 = *(float *)(ray + k * 4 + 0x10);
            fVar161 = *(float *)(ray + k * 4 + 0x20);
            fVar19 = *(float *)(ray + k * 4 + 0x40);
            fVar59 = *(float *)(ray + k * 4 + 0x50);
            fVar80 = (*(float *)pGVar40 * local_808 + *(float *)pGVar3 * fVar103) - fVar147;
            fVar82 = (*(float *)pGVar25 * fStack_804 + *(float *)pGVar4 * fVar105) - fVar147;
            fVar95 = (fVar58 * fStack_800 + fVar136 * fVar141) - fVar147;
            fVar96 = (fVar77 * fStack_7fc + fVar106 * fVar144) - fVar147;
            local_8b8 = (*(float *)pGVar8 * local_808 + *(float *)pGVar54 * fVar103) - fVar143;
            fStack_8b4 = (*(float *)pGVar1 * fStack_804 + *(float *)pGVar5 * fVar105) - fVar143;
            fStack_8b0 = (fVar79 * fStack_800 + fVar138 * fVar141) - fVar143;
            fStack_8ac = (fVar81 * fStack_7fc + fVar121 * fVar144) - fVar143;
            fVar172 = (*(float *)pGVar2 * local_808 + *(float *)pGVar52 * fVar103) - fVar161;
            fVar174 = (*(float *)pGVar51 * fStack_804 + *(float *)pGVar6 * fVar105) - fVar161;
            fVar180 = (fVar107 * fStack_800 + fVar149 * fVar141) - fVar161;
            fVar182 = (fVar119 * fStack_7fc + fVar153 * fVar144) - fVar161;
            fVar75 = (fVar58 * local_808 + fVar136 * fVar103) - fVar147;
            fVar136 = (fVar58 * fStack_804 + fVar136 * fVar105) - fVar147;
            fVar78 = (fVar60 * fStack_800 + fVar137 * fVar141) - fVar147;
            fVar137 = (fVar60 * fStack_7fc + fVar137 * fVar144) - fVar147;
            fVar156 = (fVar79 * local_808 + fVar138 * fVar103) - fVar143;
            fVar160 = (fVar79 * fStack_804 + fVar138 * fVar105) - fVar143;
            fVar164 = (fVar142 * fStack_800 + fVar139 * fVar141) - fVar143;
            fVar169 = (fVar142 * fStack_7fc + fVar139 * fVar144) - fVar143;
            fVar97 = (fVar107 * local_808 + fVar149 * fVar103) - fVar161;
            fVar149 = (fVar107 * fStack_804 + fVar149 * fVar105) - fVar161;
            fVar98 = (fVar125 * fStack_800 + fVar155 * fVar141) - fVar161;
            fVar155 = (fVar125 * fStack_7fc + fVar155 * fVar144) - fVar161;
            fVar138 = (*(float *)pGVar25 * local_808 + *(float *)pGVar4 * fVar103) - fVar147;
            fVar139 = (fVar77 * fStack_804 + fVar106 * fVar105) - fVar147;
            fVar106 = (fVar77 * fStack_800 + fVar106 * fVar141) - fVar147;
            fVar147 = (fVar76 * fStack_7fc + fVar118 * fVar144) - fVar147;
            fVar76 = (*(float *)pGVar1 * local_808 + *(float *)pGVar5 * fVar103) - fVar143;
            fVar79 = (fVar81 * fStack_804 + fVar121 * fVar105) - fVar143;
            fVar125 = (fVar81 * fStack_800 + fVar121 * fVar141) - fVar143;
            fVar143 = (fVar158 * fStack_7fc + fVar124 * fVar144) - fVar143;
            fVar104 = (*(float *)pGVar51 * local_808 + *(float *)pGVar6 * fVar103) - fVar161;
            fVar105 = (fVar119 * fStack_804 + fVar153 * fVar105) - fVar161;
            fVar141 = (fVar119 * fStack_800 + fVar153 * fVar141) - fVar161;
            fVar161 = (fVar122 * fStack_7fc + fVar140 * fVar144) - fVar161;
            fVar144 = fVar138 - fVar80;
            fVar146 = fVar139 - fVar82;
            fStack_a20 = fVar106 - fVar95;
            fStack_a1c = fVar147 - fVar96;
            fVar119 = fVar76 - local_8b8;
            fVar118 = fVar79 - fStack_8b4;
            fVar124 = fVar125 - fStack_8b0;
            fVar140 = fVar143 - fStack_8ac;
            fVar157 = fVar104 - fVar172;
            fVar162 = fVar105 - fVar174;
            fVar167 = fVar141 - fVar180;
            fVar170 = fVar161 - fVar182;
            fVar58 = *(float *)(ray + k * 4 + 0x60);
            fVar159 = fVar80 - fVar75;
            fVar163 = fVar82 - fVar136;
            fVar168 = fVar95 - fVar78;
            fVar171 = fVar96 - fVar137;
            fVar145 = local_8b8 - fVar156;
            fVar148 = fStack_8b4 - fVar160;
            fVar152 = fStack_8b0 - fVar164;
            fVar154 = fStack_8ac - fVar169;
            fVar77 = (fVar119 * (fVar104 + fVar172) - (fVar76 + local_8b8) * fVar157) * fVar19 +
                     ((fVar138 + fVar80) * fVar157 - (fVar104 + fVar172) * fVar144) * fVar59 +
                     (fVar144 * (fVar76 + local_8b8) - (fVar138 + fVar80) * fVar119) * fVar58;
            fVar60 = (fVar118 * (fVar105 + fVar174) - (fVar79 + fStack_8b4) * fVar162) * fVar19 +
                     ((fVar139 + fVar82) * fVar162 - (fVar105 + fVar174) * fVar146) * fVar59 +
                     (fVar146 * (fVar79 + fStack_8b4) - (fVar139 + fVar82) * fVar118) * fVar58;
            auVar68._0_8_ = CONCAT44(fVar60,fVar77);
            auVar68._8_4_ =
                 (fVar124 * (fVar141 + fVar180) - (fVar125 + fStack_8b0) * fVar167) * fVar19 +
                 ((fVar106 + fVar95) * fVar167 - (fVar141 + fVar180) * fStack_a20) * fVar59 +
                 (fStack_a20 * (fVar125 + fStack_8b0) - (fVar106 + fVar95) * fVar124) * fVar58;
            auVar68._12_4_ =
                 (fVar140 * (fVar161 + fVar182) - (fVar143 + fStack_8ac) * fVar170) * fVar19 +
                 ((fVar147 + fVar96) * fVar170 - (fVar161 + fVar182) * fStack_a1c) * fVar59 +
                 (fStack_a1c * (fVar143 + fStack_8ac) - (fVar147 + fVar96) * fVar140) * fVar58;
            fVar81 = fVar172 - fVar97;
            fVar142 = fVar174 - fVar149;
            fVar158 = fVar180 - fVar98;
            fVar107 = fVar182 - fVar155;
            local_8f8 = (fVar145 * (fVar172 + fVar97) - (local_8b8 + fVar156) * fVar81) * fVar19 +
                        ((fVar80 + fVar75) * fVar81 - (fVar172 + fVar97) * fVar159) * fVar59 +
                        (fVar159 * (local_8b8 + fVar156) - (fVar80 + fVar75) * fVar145) * fVar58;
            fStack_8f4 = (fVar148 * (fVar174 + fVar149) - (fStack_8b4 + fVar160) * fVar142) * fVar19
                         + ((fVar82 + fVar136) * fVar142 - (fVar174 + fVar149) * fVar163) * fVar59 +
                           (fVar163 * (fStack_8b4 + fVar160) - (fVar82 + fVar136) * fVar148) *
                           fVar58;
            fStack_8f0 = (fVar152 * (fVar180 + fVar98) - (fStack_8b0 + fVar164) * fVar158) * fVar19
                         + ((fVar95 + fVar78) * fVar158 - (fVar180 + fVar98) * fVar168) * fVar59 +
                           (fVar168 * (fStack_8b0 + fVar164) - (fVar95 + fVar78) * fVar152) * fVar58
            ;
            fStack_8ec = (fVar154 * (fVar182 + fVar155) - (fStack_8ac + fVar169) * fVar107) * fVar19
                         + ((fVar96 + fVar137) * fVar107 - (fVar182 + fVar155) * fVar171) * fVar59 +
                           (fVar171 * (fStack_8ac + fVar169) - (fVar96 + fVar137) * fVar154) *
                           fVar58;
            fVar173 = fVar75 - fVar138;
            fVar175 = fVar136 - fVar139;
            fVar181 = fVar78 - fVar106;
            fVar183 = fVar137 - fVar147;
            local_8c8 = fVar156 - fVar76;
            fStack_8c4 = fVar160 - fVar79;
            fStack_8c0 = fVar164 - fVar125;
            fStack_8bc = fVar169 - fVar143;
            fVar122 = fVar97 - fVar104;
            fVar121 = fVar149 - fVar105;
            fVar153 = fVar98 - fVar141;
            fVar103 = fVar155 - fVar161;
            fStack_8d0 = auVar68._8_4_;
            local_8d8 = (undefined1  [8])auVar68._0_8_;
            fStack_8cc = auVar68._12_4_;
            auVar90._0_4_ =
                 (local_8c8 * (fVar104 + fVar97) - (fVar76 + fVar156) * fVar122) * fVar19 +
                 ((fVar138 + fVar75) * fVar122 - (fVar104 + fVar97) * fVar173) * fVar59 +
                 (fVar173 * (fVar76 + fVar156) - (fVar138 + fVar75) * local_8c8) * fVar58;
            auVar90._4_4_ =
                 (fStack_8c4 * (fVar105 + fVar149) - (fVar79 + fVar160) * fVar121) * fVar19 +
                 ((fVar139 + fVar136) * fVar121 - (fVar105 + fVar149) * fVar175) * fVar59 +
                 (fVar175 * (fVar79 + fVar160) - (fVar139 + fVar136) * fStack_8c4) * fVar58;
            auVar90._8_4_ =
                 (fStack_8c0 * (fVar141 + fVar98) - (fVar125 + fVar164) * fVar153) * fVar19 +
                 ((fVar106 + fVar78) * fVar153 - (fVar141 + fVar98) * fVar181) * fVar59 +
                 (fVar181 * (fVar125 + fVar164) - (fVar106 + fVar78) * fStack_8c0) * fVar58;
            auVar90._12_4_ =
                 (fStack_8bc * (fVar161 + fVar155) - (fVar143 + fVar169) * fVar103) * fVar19 +
                 ((fVar147 + fVar137) * fVar103 - (fVar161 + fVar155) * fVar183) * fVar59 +
                 (fVar183 * (fVar143 + fVar169) - (fVar147 + fVar137) * fStack_8bc) * fVar58;
            local_8e8._0_4_ = fVar77 + local_8f8 + auVar90._0_4_;
            local_8e8._4_4_ = fVar60 + fStack_8f4 + auVar90._4_4_;
            local_8e8._8_4_ = auVar68._8_4_ + fStack_8f0 + auVar90._8_4_;
            local_8e8._12_4_ = auVar68._12_4_ + fStack_8ec + auVar90._12_4_;
            auVar34._4_4_ = fStack_8f4;
            auVar34._0_4_ = local_8f8;
            auVar34._8_4_ = fStack_8f0;
            auVar34._12_4_ = fStack_8ec;
            auVar83 = minps(auVar68,auVar34);
            auVar83 = minps(auVar83,auVar90);
            auVar35._4_4_ = fStack_8f4;
            auVar35._0_4_ = local_8f8;
            auVar35._8_4_ = fStack_8f0;
            auVar35._12_4_ = fStack_8ec;
            auVar111 = maxps(_local_8d8,auVar35);
            auVar111 = maxps(auVar111,auVar90);
            fVar76 = ABS(local_8e8._0_4_) * 1.1920929e-07;
            fVar79 = ABS(local_8e8._4_4_) * 1.1920929e-07;
            auVar135._4_4_ = -(uint)(auVar111._4_4_ <= fVar79);
            auVar135._0_4_ = -(uint)(auVar111._0_4_ <= fVar76);
            auVar135._8_4_ = -(uint)(auVar111._8_4_ <= ABS(local_8e8._8_4_) * 1.1920929e-07);
            auVar135._12_4_ = -(uint)(auVar111._12_4_ <= ABS(local_8e8._12_4_) * 1.1920929e-07);
            in_XMM1._0_8_ = CONCAT44(fVar79,fVar76) ^ 0x8000000080000000;
            in_XMM1._8_4_ = -(ABS(local_8e8._8_4_) * 1.1920929e-07);
            in_XMM1._12_4_ = -(ABS(local_8e8._12_4_) * 1.1920929e-07);
            auVar69._4_4_ = -(uint)(-fVar79 <= auVar83._4_4_);
            auVar69._0_4_ = -(uint)(-fVar76 <= auVar83._0_4_);
            auVar69._8_4_ = -(uint)(in_XMM1._8_4_ <= auVar83._8_4_);
            auVar69._12_4_ = -(uint)(in_XMM1._12_4_ <= auVar83._12_4_);
            auVar135 = auVar135 | auVar69;
            iVar43 = movmskps((int)&local_a10,auVar135);
            if (iVar43 != 0) {
              auVar116._0_4_ = fVar119 * fVar81 - fVar145 * fVar157;
              auVar116._4_4_ = fVar118 * fVar142 - fVar148 * fVar162;
              auVar116._8_4_ = fVar124 * fVar158 - fVar152 * fVar167;
              auVar116._12_4_ = fVar140 * fVar107 - fVar154 * fVar170;
              auVar166._0_4_ = fVar145 * fVar122 - local_8c8 * fVar81;
              auVar166._4_4_ = fVar148 * fVar121 - fStack_8c4 * fVar142;
              auVar166._8_4_ = fVar152 * fVar153 - fStack_8c0 * fVar158;
              auVar166._12_4_ = fVar154 * fVar103 - fStack_8bc * fVar107;
              auVar70._4_4_ = -(uint)(ABS(fVar148 * fVar162) < ABS(fStack_8c4 * fVar142));
              auVar70._0_4_ = -(uint)(ABS(fVar145 * fVar157) < ABS(local_8c8 * fVar81));
              auVar70._8_4_ = -(uint)(ABS(fVar152 * fVar167) < ABS(fStack_8c0 * fVar158));
              auVar70._12_4_ = -(uint)(ABS(fVar154 * fVar170) < ABS(fStack_8bc * fVar107));
              local_928 = blendvps(auVar166,auVar116,auVar70);
              auVar179._0_4_ = fVar173 * fVar81 - fVar159 * fVar122;
              auVar179._4_4_ = fVar175 * fVar142 - fVar163 * fVar121;
              auVar179._8_4_ = fVar181 * fVar158 - fVar168 * fVar153;
              auVar179._12_4_ = fVar183 * fVar107 - fVar171 * fVar103;
              auVar71._4_4_ = -(uint)(ABS(fVar146 * fVar142) < ABS(fVar163 * fVar121));
              auVar71._0_4_ = -(uint)(ABS(fVar144 * fVar81) < ABS(fVar159 * fVar122));
              auVar71._8_4_ = -(uint)(ABS(fStack_a20 * fVar158) < ABS(fVar168 * fVar153));
              auVar71._12_4_ = -(uint)(ABS(fStack_a1c * fVar107) < ABS(fVar171 * fVar103));
              auVar36._4_4_ = fVar162 * fVar163 - fVar146 * fVar142;
              auVar36._0_4_ = fVar157 * fVar159 - fVar144 * fVar81;
              auVar36._8_4_ = fVar167 * fVar168 - fStack_a20 * fVar158;
              auVar36._12_4_ = fVar170 * fVar171 - fStack_a1c * fVar107;
              local_918 = blendvps(auVar179,auVar36,auVar71);
              auVar177._0_4_ = fVar159 * local_8c8 - fVar173 * fVar145;
              auVar177._4_4_ = fVar163 * fStack_8c4 - fVar175 * fVar148;
              auVar177._8_4_ = fVar168 * fStack_8c0 - fVar181 * fVar152;
              auVar177._12_4_ = fVar171 * fStack_8bc - fVar183 * fVar154;
              auVar72._4_4_ = -(uint)(ABS(fVar163 * fVar118) < ABS(fVar175 * fVar148));
              auVar72._0_4_ = -(uint)(ABS(fVar159 * fVar119) < ABS(fVar173 * fVar145));
              auVar72._8_4_ = -(uint)(ABS(fVar168 * fVar124) < ABS(fVar181 * fVar152));
              auVar72._12_4_ = -(uint)(ABS(fVar171 * fVar140) < ABS(fVar183 * fVar154));
              auVar38._4_4_ = fVar146 * fVar148 - fVar163 * fVar118;
              auVar38._0_4_ = fVar144 * fVar145 - fVar159 * fVar119;
              auVar38._8_4_ = fStack_a20 * fVar152 - fVar168 * fVar124;
              auVar38._12_4_ = fStack_a1c * fVar154 - fVar171 * fVar140;
              local_908 = blendvps(auVar177,auVar38,auVar72);
              auVar91._0_4_ = fVar58 * local_908._0_4_;
              auVar91._4_4_ = fVar58 * local_908._4_4_;
              auVar91._8_4_ = fVar58 * local_908._8_4_;
              auVar91._12_4_ = fVar58 * local_908._12_4_;
              fVar122 = fVar19 * local_928._0_4_ + fVar59 * local_918._0_4_ + auVar91._0_4_;
              fVar125 = fVar19 * local_928._4_4_ + fVar59 * local_918._4_4_ + auVar91._4_4_;
              fVar136 = fVar19 * local_928._8_4_ + fVar59 * local_918._8_4_ + auVar91._8_4_;
              fVar106 = fVar19 * local_928._12_4_ + fVar59 * local_918._12_4_ + auVar91._12_4_;
              fVar122 = fVar122 + fVar122;
              fVar125 = fVar125 + fVar125;
              fVar136 = fVar136 + fVar136;
              fVar106 = fVar106 + fVar106;
              fVar142 = fVar80 * local_928._0_4_ +
                        local_8b8 * local_918._0_4_ + fVar172 * local_908._0_4_;
              fVar158 = fVar82 * local_928._4_4_ +
                        fStack_8b4 * local_918._4_4_ + fVar174 * local_908._4_4_;
              fVar107 = fVar95 * local_928._8_4_ +
                        fStack_8b0 * local_918._8_4_ + fVar180 * local_908._8_4_;
              fVar119 = fVar96 * local_928._12_4_ +
                        fStack_8ac * local_918._12_4_ + fVar182 * local_908._12_4_;
              auVar32._4_4_ = fVar125;
              auVar32._0_4_ = fVar122;
              auVar32._8_4_ = fVar136;
              auVar32._12_4_ = fVar106;
              auVar83 = rcpps(auVar91,auVar32);
              fVar58 = auVar83._0_4_;
              fVar76 = auVar83._4_4_;
              fVar79 = auVar83._8_4_;
              fVar81 = auVar83._12_4_;
              local_938._0_4_ = ((1.0 - fVar122 * fVar58) * fVar58 + fVar58) * (fVar142 + fVar142);
              local_938._4_4_ = ((1.0 - fVar125 * fVar76) * fVar76 + fVar76) * (fVar158 + fVar158);
              local_938._8_4_ = ((1.0 - fVar136 * fVar79) * fVar79 + fVar79) * (fVar107 + fVar107);
              local_938._12_4_ = ((1.0 - fVar106 * fVar81) * fVar81 + fVar81) * (fVar119 + fVar119);
              fVar58 = *(float *)(ray + k * 4 + 0x80);
              fVar76 = *(float *)(ray + k * 4 + 0x30);
              in_XMM1._0_4_ =
                   -(uint)(local_938._0_4_ <= fVar58 && fVar76 <= local_938._0_4_) & auVar135._0_4_;
              in_XMM1._4_4_ =
                   -(uint)(local_938._4_4_ <= fVar58 && fVar76 <= local_938._4_4_) & auVar135._4_4_;
              in_XMM1._8_4_ =
                   (float)(-(uint)(local_938._8_4_ <= fVar58 && fVar76 <= local_938._8_4_) &
                          auVar135._8_4_);
              in_XMM1._12_4_ =
                   (float)(-(uint)(local_938._12_4_ <= fVar58 && fVar76 <= local_938._12_4_) &
                          auVar135._12_4_);
              iVar43 = movmskps(iVar43,in_XMM1);
              if (iVar43 != 0) {
                in_XMM1._0_4_ = in_XMM1._0_4_ & -(uint)(fVar122 != 0.0);
                in_XMM1._4_4_ = in_XMM1._4_4_ & -(uint)(fVar125 != 0.0);
                in_XMM1._8_4_ = (float)((uint)in_XMM1._8_4_ & -(uint)(fVar136 != 0.0));
                in_XMM1._12_4_ = (float)((uint)in_XMM1._12_4_ & -(uint)(fVar106 != 0.0));
                iVar43 = movmskps(iVar43,in_XMM1);
                if (iVar43 != 0) {
                  pGVar26 = (context->scene->geometries).items[uVar24].ptr;
                  if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar26->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002ab5cc;
                    auVar83 = rcpps(local_8e8,local_8e8);
                    fVar58 = auVar83._0_4_;
                    fVar76 = auVar83._4_4_;
                    fVar79 = auVar83._8_4_;
                    fVar81 = auVar83._12_4_;
                    fVar58 = (float)(-(uint)(1e-18 <= ABS(local_8e8._0_4_)) &
                                    (uint)(((float)DAT_01feca10 - local_8e8._0_4_ * fVar58) * fVar58
                                          + fVar58));
                    fVar76 = (float)(-(uint)(1e-18 <= ABS(local_8e8._4_4_)) &
                                    (uint)((DAT_01feca10._4_4_ - local_8e8._4_4_ * fVar76) * fVar76
                                          + fVar76));
                    fVar79 = (float)(-(uint)(1e-18 <= ABS(local_8e8._8_4_)) &
                                    (uint)((DAT_01feca10._8_4_ - local_8e8._8_4_ * fVar79) * fVar79
                                          + fVar79));
                    fVar81 = (float)(-(uint)(1e-18 <= ABS(local_8e8._12_4_)) &
                                    (uint)((DAT_01feca10._12_4_ - local_8e8._12_4_ * fVar81) *
                                           fVar81 + fVar81));
                    auVar92._0_4_ = fVar77 * fVar58;
                    auVar92._4_4_ = fVar60 * fVar76;
                    auVar92._8_4_ = auVar68._8_4_ * fVar79;
                    auVar92._12_4_ = auVar68._12_4_ * fVar81;
                    auVar93 = minps(auVar92,_DAT_01feca10);
                    auVar73._0_4_ = fVar58 * local_8f8;
                    auVar73._4_4_ = fVar76 * fStack_8f4;
                    auVar73._8_4_ = fVar79 * fStack_8f0;
                    auVar73._12_4_ = fVar81 * fStack_8ec;
                    auVar114 = minps(auVar73,_DAT_01feca10);
                    auVar83 = *(undefined1 (*) [16])local_a10;
                    auVar130 = auVar83._0_12_;
                    auVar111 = *(undefined1 (*) [16])(local_a10 + local_a08 * 4);
                    auVar110 = auVar111._0_12_;
                    if (local_a08 == 2) {
                      auVar130._0_8_ = auVar83._0_8_;
                      auVar130._8_4_ = auVar83._4_4_;
                      auVar110._0_8_ = auVar111._0_8_;
                      auVar110._8_4_ = auVar111._4_4_;
                    }
                    auVar132._4_4_ = auVar130._4_4_;
                    auVar132._8_4_ = auVar130._8_4_;
                    auVar102._0_8_ = auVar130._0_8_;
                    auVar102._8_4_ = auVar132._4_4_;
                    uVar120 = auVar110._4_4_;
                    auVar102._12_4_ = uVar120;
                    auVar101._8_8_ = auVar102._8_8_;
                    auVar101._0_4_ = auVar130._0_4_;
                    uVar108 = auVar110._0_4_;
                    auVar101._4_4_ = uVar108;
                    auVar132._0_4_ = auVar132._4_4_;
                    auVar132._12_4_ = auVar132._8_4_;
                    auVar117._0_8_ = auVar110._0_8_;
                    auVar117._8_4_ = uVar120;
                    auVar117._12_4_ = auVar110._8_4_;
                    auVar83 = ZEXT816(0);
                    pblendw(auVar101,auVar83,0xaa);
                    fVar58 = (float)DAT_0201c970;
                    fVar77 = DAT_0201c970._4_4_;
                    fVar60 = DAT_0201c970._8_4_;
                    fVar76 = DAT_0201c970._12_4_;
                    pblendw(auVar132,auVar83,0xaa);
                    pblendw(auVar117,auVar83,0xaa);
                    local_948[1] = ((1.0 - auVar93._4_4_) - auVar114._4_4_) *
                                   (float)(uVar108 >> 0x10) * fVar77 +
                                   (float)(uVar120 >> 0x10) * fVar77 * auVar114._4_4_ +
                                   (float)(auVar132._4_4_ >> 0x10) * fVar77 * auVar93._4_4_;
                    local_948[0] = ((1.0 - auVar93._0_4_) - auVar114._0_4_) *
                                   (float)(auVar101._0_4_ >> 0x10) * fVar58 +
                                   (float)(uVar108 >> 0x10) * fVar58 * auVar114._0_4_ +
                                   (float)(auVar132._4_4_ >> 0x10) * fVar58 * auVar93._0_4_;
                    local_948[2] = ((1.0 - auVar93._8_4_) - auVar114._8_4_) *
                                   (float)(auVar132._4_4_ >> 0x10) * fVar60 +
                                   (float)(uVar120 >> 0x10) * fVar60 * auVar114._8_4_ +
                                   (float)(auVar132._8_4_ >> 0x10) * fVar60 * auVar93._8_4_;
                    local_948[3] = ((1.0 - auVar93._12_4_) - auVar114._12_4_) *
                                   (float)(uVar120 >> 0x10) * fVar76 +
                                   (float)(auVar110._8_4_ >> 0x10) * fVar76 * auVar114._12_4_ +
                                   (float)(auVar132._8_4_ >> 0x10) * fVar76 * auVar93._12_4_;
                    uVar44 = movmskps(uVar44,in_XMM1);
                    uVar42 = (ulong)uVar44;
                    uVar39 = 0;
                    if (uVar42 != 0) {
                      for (; (uVar44 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                      }
                    }
                    bVar57 = uVar44 == 0;
                    in_XMM1 = auVar93;
                    if (!bVar57) {
                      local_a28._0_4_ = (undefined4)*(undefined8 *)*local_9e0;
                      local_a28._4_4_ = (undefined4)((ulong)*(undefined8 *)*local_9e0 >> 0x20);
                      fStack_a20 = (float)*(undefined8 *)(*local_9e0 + 8);
                      fStack_a1c = (float)((ulong)*(undefined8 *)(*local_9e0 + 8) >> 0x20);
                      local_a00 = (ulong)uVar23;
                      do {
                        uVar20 = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_868 = local_948[uVar39 - 4];
                        fVar58 = local_948[uVar39];
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_938 + uVar39 * 4);
                        args.context = context->user;
                        local_858._4_4_ = fVar58;
                        local_858._0_4_ = fVar58;
                        local_858._8_4_ = fVar58;
                        local_858._12_4_ = fVar58;
                        local_898 = *(undefined4 *)(local_928 + uVar39 * 4);
                        uVar21 = *(undefined4 *)(local_918 + uVar39 * 4);
                        uVar22 = *(undefined4 *)(local_908 + uVar39 * 4);
                        local_888._4_4_ = uVar21;
                        local_888._0_4_ = uVar21;
                        local_888._8_4_ = uVar21;
                        local_888._12_4_ = uVar21;
                        local_878._4_4_ = uVar22;
                        local_878._0_4_ = uVar22;
                        local_878._8_4_ = uVar22;
                        local_878._12_4_ = uVar22;
                        uStack_894 = local_898;
                        uStack_890 = local_898;
                        uStack_88c = local_898;
                        fStack_864 = local_868;
                        fStack_860 = local_868;
                        fStack_85c = local_868;
                        local_848 = CONCAT44(uVar47,uVar47);
                        uStack_840 = CONCAT44(uVar47,uVar47);
                        local_838 = CONCAT44(uVar24,uVar24);
                        uStack_830 = CONCAT44(uVar24,uVar24);
                        local_828 = (args.context)->instID[0];
                        uStack_824 = local_828;
                        uStack_820 = local_828;
                        uStack_81c = local_828;
                        local_818 = (args.context)->instPrimID[0];
                        uStack_814 = local_818;
                        uStack_810 = local_818;
                        uStack_80c = local_818;
                        local_a48._4_4_ = local_a28._4_4_;
                        local_a48._0_4_ = (undefined4)local_a28;
                        local_a48._8_4_ = fStack_a20;
                        local_a48._12_4_ = fStack_a1c;
                        args.valid = (int *)local_a48;
                        args.geometryUserPtr = pGVar26->userPtr;
                        args.hit = (RTCHitN *)&local_898;
                        args.N = 4;
                        args.ray = (RTCRayN *)ray;
                        if (pGVar26->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar26->occlusionFilterN)(&args);
                        }
                        if (local_a48 == (undefined1  [16])0x0) {
                          auVar94._8_4_ = 0xffffffff;
                          auVar94._0_8_ = 0xffffffffffffffff;
                          auVar94._12_4_ = 0xffffffff;
                          in_XMM1 = auVar94 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var27 = context->args->filter;
                          if ((p_Var27 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var27)(&args);
                          }
                          auVar74._0_4_ = -(uint)(local_a48._0_4_ == 0);
                          auVar74._4_4_ = -(uint)(local_a48._4_4_ == 0);
                          auVar74._8_4_ = -(uint)(local_a48._8_4_ == 0);
                          auVar74._12_4_ = -(uint)(local_a48._12_4_ == 0);
                          in_XMM1 = auVar74 ^ _DAT_01febe20;
                          auVar83 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),
                                             auVar74);
                          *(undefined1 (*) [16])(args.ray + 0x80) = auVar83;
                        }
                        if ((_DAT_01fecb20 & in_XMM1) != (undefined1  [16])0x0) {
                          if (!bVar57) {
                            bVar57 = true;
                            sVar41 = 0;
                            goto LAB_002ab615;
                          }
                          break;
                        }
                        *(undefined4 *)(ray + k * 4 + 0x80) = uVar20;
                        uVar42 = uVar42 ^ 1L << (uVar39 & 0x3f);
                        uVar39 = 0;
                        if (uVar42 != 0) {
                          for (; (uVar42 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                          }
                        }
                        bVar57 = uVar42 == 0;
                      } while (!bVar57);
                    }
                  }
                }
              }
            }
          }
          sVar41 = 0;
          goto LAB_002ab692;
        }
        auVar178._0_4_ = local_8c8 * (float)local_8d8._0_4_ - fVar149 * local_8b8;
        auVar178._4_4_ = fStack_8c4 * (float)local_8d8._4_4_ - fVar153 * fStack_8b4;
        auVar178._8_4_ = fStack_8c0 * fStack_8d0 - fVar155 * fStack_8b0;
        auVar178._12_4_ = fStack_8bc * fStack_8cc - fVar157 * fStack_8ac;
        auVar151._0_4_ = fVar149 * local_8e8._0_4_ - fVar136 * (float)local_8d8._0_4_;
        auVar151._4_4_ = fVar153 * local_8e8._4_4_ - fVar137 * (float)local_8d8._4_4_;
        auVar151._8_4_ = fVar155 * local_8e8._8_4_ - fVar138 * fStack_8d0;
        auVar151._12_4_ = fVar157 * local_8e8._12_4_ - fVar139 * fStack_8cc;
        uVar108 = (uint)DAT_01fec6c0;
        uVar120 = DAT_01fec6c0._4_4_;
        uVar123 = DAT_01fec6c0._8_4_;
        uVar126 = DAT_01fec6c0._12_4_;
        auVar63._4_4_ =
             -(uint)((float)((uint)(fVar153 * fStack_8b4) & uVar120) <
                    (float)((uint)(fVar137 * (float)local_8d8._4_4_) & uVar120));
        auVar63._0_4_ =
             -(uint)((float)((uint)(fVar149 * local_8b8) & uVar108) <
                    (float)((uint)(fVar136 * (float)local_8d8._0_4_) & uVar108));
        auVar63._8_4_ =
             -(uint)((float)((uint)(fVar155 * fStack_8b0) & uVar123) <
                    (float)((uint)(fVar138 * fStack_8d0) & uVar123));
        auVar63._12_4_ =
             -(uint)((float)((uint)(fVar157 * fStack_8ac) & uVar126) <
                    (float)((uint)(fVar139 * fStack_8cc) & uVar126));
        local_928 = blendvps(auVar151,auVar178,auVar63);
        auVar165._0_4_ = fVar164 * (float)local_8d8._0_4_ - fVar107 * local_8e8._0_4_;
        auVar165._4_4_ = fVar169 * (float)local_8d8._4_4_ - fVar119 * local_8e8._4_4_;
        auVar165._8_4_ = fVar172 * fStack_8d0 - fVar122 * local_8e8._8_4_;
        auVar165._12_4_ = fVar175 * fStack_8cc - fVar125 * local_8e8._12_4_;
        auVar64._4_4_ =
             -(uint)((float)((uint)(fVar168 * (float)local_8d8._4_4_) & uVar120) <
                    (float)((uint)(fVar119 * local_8e8._4_4_) & uVar120));
        auVar64._0_4_ =
             -(uint)((float)((uint)(fVar163 * (float)local_8d8._0_4_) & uVar108) <
                    (float)((uint)(fVar107 * local_8e8._0_4_) & uVar108));
        auVar64._8_4_ =
             -(uint)((float)((uint)(fVar171 * fStack_8d0) & uVar123) <
                    (float)((uint)(fVar122 * local_8e8._8_4_) & uVar123));
        auVar64._12_4_ =
             -(uint)((float)((uint)(fVar174 * fStack_8cc) & uVar126) <
                    (float)((uint)(fVar125 * local_8e8._12_4_) & uVar126));
        auVar31._4_4_ = fStack_8b4 * fVar119 - fVar168 * (float)local_8d8._4_4_;
        auVar31._0_4_ = local_8b8 * fVar107 - fVar163 * (float)local_8d8._0_4_;
        auVar31._8_4_ = fStack_8b0 * fVar122 - fVar171 * fStack_8d0;
        auVar31._12_4_ = fStack_8ac * fVar125 - fVar174 * fStack_8cc;
        local_918 = blendvps(auVar165,auVar31,auVar64);
        auVar128._0_4_ = fVar107 * fVar136 - fVar164 * fVar149;
        auVar128._4_4_ = fVar119 * fVar137 - fVar169 * fVar153;
        auVar128._8_4_ = fVar122 * fVar138 - fVar172 * fVar155;
        auVar128._12_4_ = fVar125 * fVar139 - fVar175 * fVar157;
        auVar65._4_4_ =
             -(uint)((float)((uint)(fVar119 * fStack_8c4) & uVar120) <
                    (float)((uint)(fVar169 * fVar153) & uVar120));
        auVar65._0_4_ =
             -(uint)((float)((uint)(fVar107 * local_8c8) & uVar108) <
                    (float)((uint)(fVar164 * fVar149) & uVar108));
        auVar65._8_4_ =
             -(uint)((float)((uint)(fVar122 * fStack_8c0) & uVar123) <
                    (float)((uint)(fVar172 * fVar155) & uVar123));
        auVar65._12_4_ =
             -(uint)((float)((uint)(fVar125 * fStack_8bc) & uVar126) <
                    (float)((uint)(fVar175 * fVar157) & uVar126));
        auVar37._4_4_ = fVar168 * fVar153 - fVar119 * fStack_8c4;
        auVar37._0_4_ = fVar163 * fVar149 - fVar107 * local_8c8;
        auVar37._8_4_ = fVar171 * fVar155 - fVar122 * fStack_8c0;
        auVar37._12_4_ = fVar174 * fVar157 - fVar125 * fStack_8bc;
        local_908 = blendvps(auVar128,auVar37,auVar65);
        fVar107 = fVar19 * local_928._0_4_ + fVar58 * local_918._0_4_ + fVar77 * local_908._0_4_;
        fVar119 = fVar19 * local_928._4_4_ + fVar58 * local_918._4_4_ + fVar77 * local_908._4_4_;
        fVar122 = fVar19 * local_928._8_4_ + fVar58 * local_918._8_4_ + fVar77 * local_908._8_4_;
        fVar125 = fVar19 * local_928._12_4_ + fVar58 * local_918._12_4_ + fVar77 * local_908._12_4_;
        fVar107 = fVar107 + fVar107;
        fVar119 = fVar119 + fVar119;
        fVar122 = fVar122 + fVar122;
        fVar125 = fVar125 + fVar125;
        auVar86._0_4_ = fVar59 * local_908._0_4_;
        auVar86._4_4_ = fVar75 * local_908._4_4_;
        auVar86._8_4_ = fVar78 * local_908._8_4_;
        auVar86._12_4_ = fVar80 * local_908._12_4_;
        fVar136 = fVar98 * local_928._0_4_ + fVar82 * local_918._0_4_ + auVar86._0_4_;
        fVar106 = fVar103 * local_928._4_4_ + fVar95 * local_918._4_4_ + auVar86._4_4_;
        fVar137 = fVar104 * local_928._8_4_ + fVar96 * local_918._8_4_ + auVar86._8_4_;
        fVar118 = fVar105 * local_928._12_4_ + fVar97 * local_918._12_4_ + auVar86._12_4_;
        auVar33._4_4_ = fVar119;
        auVar33._0_4_ = fVar107;
        auVar33._8_4_ = fVar122;
        auVar33._12_4_ = fVar125;
        auVar83 = rcpps(auVar86,auVar33);
        fVar58 = auVar83._0_4_;
        fVar77 = auVar83._4_4_;
        fVar142 = auVar83._8_4_;
        fVar158 = auVar83._12_4_;
        local_938._0_4_ = ((1.0 - fVar107 * fVar58) * fVar58 + fVar58) * (fVar136 + fVar136);
        local_938._4_4_ = ((1.0 - fVar119 * fVar77) * fVar77 + fVar77) * (fVar106 + fVar106);
        local_938._8_4_ = ((1.0 - fVar122 * fVar142) * fVar142 + fVar142) * (fVar137 + fVar137);
        local_938._12_4_ = ((1.0 - fVar125 * fVar158) * fVar158 + fVar158) * (fVar118 + fVar118);
        fVar58 = *(float *)(ray + k * 4 + 0x80);
        fVar77 = *(float *)(ray + k * 4 + 0x30);
        in_XMM1._0_4_ =
             -(uint)(local_938._0_4_ <= fVar58 && fVar77 <= local_938._0_4_) & auVar134._0_4_;
        in_XMM1._4_4_ =
             -(uint)(local_938._4_4_ <= fVar58 && fVar77 <= local_938._4_4_) & auVar134._4_4_;
        in_XMM1._8_4_ =
             (float)(-(uint)(local_938._8_4_ <= fVar58 && fVar77 <= local_938._8_4_) &
                    auVar134._8_4_);
        in_XMM1._12_4_ =
             (float)(-(uint)(local_938._12_4_ <= fVar58 && fVar77 <= local_938._12_4_) &
                    auVar134._12_4_);
        iVar43 = movmskps(iVar43,in_XMM1);
        if (iVar43 == 0) goto LAB_002aae71;
        auVar87._0_4_ = in_XMM1._0_4_ & -(uint)(fVar107 != 0.0);
        auVar87._4_4_ = in_XMM1._4_4_ & -(uint)(fVar119 != 0.0);
        auVar87._8_4_ = (uint)in_XMM1._8_4_ & -(uint)(fVar122 != 0.0);
        auVar87._12_4_ = (uint)in_XMM1._12_4_ & -(uint)(fVar125 != 0.0);
        iVar43 = movmskps(iVar43,auVar87);
        in_XMM1 = auVar87;
        if (iVar43 == 0) goto LAB_002aae71;
        pGVar26 = (context->scene->geometries).items[uVar24].ptr;
        if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_002aae71;
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar26->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar83 = rcpps(local_7e8,local_7e8);
          fVar58 = auVar83._0_4_;
          fVar77 = auVar83._4_4_;
          fVar142 = auVar83._8_4_;
          fVar158 = auVar83._12_4_;
          fVar58 = (float)(-(uint)(1e-18 <= ABS(local_7e8._0_4_)) &
                          (uint)(((float)DAT_01feca10 - local_7e8._0_4_ * fVar58) * fVar58 + fVar58)
                          );
          fVar77 = (float)(-(uint)(1e-18 <= ABS(local_7e8._4_4_)) &
                          (uint)((DAT_01feca10._4_4_ - local_7e8._4_4_ * fVar77) * fVar77 + fVar77))
          ;
          fVar142 = (float)(-(uint)(1e-18 <= ABS(local_7e8._8_4_)) &
                           (uint)((DAT_01feca10._8_4_ - local_7e8._8_4_ * fVar142) * fVar142 +
                                 fVar142));
          fVar158 = (float)(-(uint)(1e-18 <= ABS(local_7e8._12_4_)) &
                           (uint)((DAT_01feca10._12_4_ - local_7e8._12_4_ * fVar158) * fVar158 +
                                 fVar158));
          auVar88._0_4_ = local_8f8 * fVar58;
          auVar88._4_4_ = fStack_8f4 * fVar77;
          auVar88._8_4_ = fStack_8f0 * fVar142;
          auVar88._12_4_ = fStack_8ec * fVar158;
          in_XMM1 = minps(auVar88,_DAT_01feca10);
          auVar66._0_4_ = fVar58 * fVar60;
          auVar66._4_4_ = fVar77 * fVar76;
          auVar66._8_4_ = fVar142 * fVar79;
          auVar66._12_4_ = fVar158 * fVar81;
          auVar114 = minps(auVar66,_DAT_01feca10);
          auVar83 = *(undefined1 (*) [16])local_a10;
          auVar129 = auVar83._0_12_;
          auVar111 = *(undefined1 (*) [16])(local_a10 + local_a08 * 4);
          auVar109 = auVar111._0_12_;
          if (local_a08 == 2) {
            auVar129._0_8_ = auVar83._0_8_;
            auVar129._8_4_ = auVar83._4_4_;
            auVar109._0_8_ = auVar111._0_8_;
            auVar109._8_4_ = auVar111._4_4_;
          }
          auVar176._4_4_ = local_9f8;
          auVar176._0_4_ = local_9f8;
          auVar176._8_4_ = local_9f8;
          auVar176._12_4_ = local_9f8;
          auVar131._4_4_ = auVar129._4_4_;
          auVar131._8_4_ = auVar129._8_4_;
          auVar100._0_8_ = auVar129._0_8_;
          auVar100._8_4_ = auVar131._4_4_;
          uVar120 = auVar109._4_4_;
          auVar100._12_4_ = uVar120;
          auVar99._8_8_ = auVar100._8_8_;
          auVar99._0_4_ = auVar129._0_4_;
          uVar108 = auVar109._0_4_;
          auVar99._4_4_ = uVar108;
          auVar131._0_4_ = auVar131._4_4_;
          auVar131._12_4_ = auVar131._8_4_;
          auVar115._0_8_ = auVar109._0_8_;
          auVar115._8_4_ = uVar120;
          auVar115._12_4_ = auVar109._8_4_;
          auVar83 = ZEXT816(0);
          pblendw(auVar99,auVar83,0xaa);
          fVar58 = (float)DAT_0201c970;
          fVar77 = DAT_0201c970._4_4_;
          fVar60 = DAT_0201c970._8_4_;
          fVar76 = DAT_0201c970._12_4_;
          pblendw(auVar131,auVar83,0xaa);
          pblendw(auVar115,auVar83,0xaa);
          local_948[1] = ((1.0 - in_XMM1._4_4_) - auVar114._4_4_) *
                         (float)(uVar108 >> 0x10) * fVar77 +
                         (float)(uVar120 >> 0x10) * fVar77 * auVar114._4_4_ +
                         (float)(auVar131._4_4_ >> 0x10) * fVar77 * in_XMM1._4_4_;
          local_948[0] = ((1.0 - in_XMM1._0_4_) - auVar114._0_4_) *
                         (float)(auVar99._0_4_ >> 0x10) * fVar58 +
                         (float)(uVar108 >> 0x10) * fVar58 * auVar114._0_4_ +
                         (float)(auVar131._4_4_ >> 0x10) * fVar58 * in_XMM1._0_4_;
          local_948[2] = ((1.0 - in_XMM1._8_4_) - auVar114._8_4_) *
                         (float)(auVar131._4_4_ >> 0x10) * fVar60 +
                         (float)(uVar120 >> 0x10) * fVar60 * auVar114._8_4_ +
                         (float)(auVar131._8_4_ >> 0x10) * fVar60 * in_XMM1._8_4_;
          local_948[3] = ((1.0 - in_XMM1._12_4_) - auVar114._12_4_) *
                         (float)(uVar120 >> 0x10) * fVar76 +
                         (float)(auVar109._8_4_ >> 0x10) * fVar76 * auVar114._12_4_ +
                         (float)(auVar131._8_4_ >> 0x10) * fVar76 * in_XMM1._12_4_;
          iVar43 = movmskps((int)local_a10,auVar87);
          local_b78 = CONCAT44((int)((ulong)local_a10 >> 0x20),iVar43);
          uVar39 = 0;
          if (local_b78 != 0) {
            for (; (local_b78 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
            }
          }
          bVar57 = iVar43 == 0;
          if (!bVar57) {
            local_af8 = CONCAT44(uVar47,uVar47);
            auVar129 = *local_9e0;
            uStack_a4c = (undefined4)((ulong)*(undefined8 *)(*local_9e0 + 8) >> 0x20);
            local_a00 = (ulong)uVar23;
            do {
              uVar20 = *(undefined4 *)(ray + k * 4 + 0x80);
              local_868 = local_948[uVar39 - 4];
              fVar58 = local_948[uVar39];
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_938 + uVar39 * 4);
              args.context = context->user;
              local_858._4_4_ = fVar58;
              local_858._0_4_ = fVar58;
              local_858._8_4_ = fVar58;
              local_858._12_4_ = fVar58;
              local_898 = *(undefined4 *)(local_928 + uVar39 * 4);
              uVar21 = *(undefined4 *)(local_918 + uVar39 * 4);
              uVar22 = *(undefined4 *)(local_908 + uVar39 * 4);
              local_888._4_4_ = uVar21;
              local_888._0_4_ = uVar21;
              local_888._8_4_ = uVar21;
              local_888._12_4_ = uVar21;
              local_878._4_4_ = uVar22;
              local_878._0_4_ = uVar22;
              local_878._8_4_ = uVar22;
              local_878._12_4_ = uVar22;
              uStack_894 = local_898;
              uStack_890 = local_898;
              uStack_88c = local_898;
              fStack_864 = local_868;
              fStack_860 = local_868;
              fStack_85c = local_868;
              local_848 = local_af8;
              uStack_840 = CONCAT44(uVar47,uVar47);
              local_838 = CONCAT44(uVar24,uVar24);
              uStack_830 = CONCAT44(uVar24,uVar24);
              local_828 = (args.context)->instID[0];
              uStack_824 = local_828;
              uStack_820 = local_828;
              uStack_81c = local_828;
              local_818 = (args.context)->instPrimID[0];
              uStack_814 = local_818;
              uStack_810 = local_818;
              uStack_80c = local_818;
              local_a48._12_4_ = uStack_a4c;
              local_a48._0_12_ = auVar129;
              args.valid = (int *)local_a48;
              args.geometryUserPtr = pGVar26->userPtr;
              args.hit = (RTCHitN *)&local_898;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar26->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar26->occlusionFilterN)(&args);
                auVar176._4_4_ = fStack_9f4;
                auVar176._0_4_ = local_9f8;
                auVar176._8_4_ = fStack_9f0;
                auVar176._12_4_ = fStack_9ec;
              }
              if (local_a48 == (undefined1  [16])0x0) {
                auVar89._8_4_ = 0xffffffff;
                auVar89._0_8_ = 0xffffffffffffffff;
                auVar89._12_4_ = 0xffffffff;
                in_XMM1 = auVar89 ^ _DAT_01febe20;
              }
              else {
                p_Var27 = context->args->filter;
                if ((p_Var27 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar26->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var27)(&args);
                  auVar176._4_4_ = fStack_9f4;
                  auVar176._0_4_ = local_9f8;
                  auVar176._8_4_ = fStack_9f0;
                  auVar176._12_4_ = fStack_9ec;
                }
                auVar67._0_4_ = -(uint)(local_a48._0_4_ == 0);
                auVar67._4_4_ = -(uint)(local_a48._4_4_ == 0);
                auVar67._8_4_ = -(uint)(local_a48._8_4_ == 0);
                auVar67._12_4_ = -(uint)(local_a48._12_4_ == 0);
                in_XMM1 = auVar67 ^ _DAT_01febe20;
                auVar83 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),auVar67);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar83;
              }
              if ((_DAT_01fecb20 & in_XMM1) != (undefined1  [16])0x0) {
                if (!bVar57) {
                  bVar57 = true;
                  sVar41 = 0;
                  goto LAB_002ab615;
                }
                break;
              }
              *(undefined4 *)(ray + k * 4 + 0x80) = uVar20;
              local_b78 = local_b78 ^ 1L << (uVar39 & 0x3f);
              uVar39 = 0;
              if (local_b78 != 0) {
                for (; (local_b78 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                }
              }
              bVar57 = local_b78 == 0;
            } while (!bVar57);
          }
          goto LAB_002aaea7;
        }
LAB_002ab5cc:
        bVar57 = true;
        sVar41 = 0;
      }
      else {
        sVar41 = *(size_t *)*(GridSOA **)(uVar39 & 0xfffffffffffffff0);
        (local_a30->super_Precalculations).grid = *(GridSOA **)(uVar39 & 0xfffffffffffffff0);
LAB_002ab692:
        bVar57 = false;
      }
LAB_002ab615:
      if (bVar57) {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar44 = 1;
      }
      else {
        uVar44 = 0;
        if (sVar41 != 0) {
          pNVar55->ptr = sVar41;
          pNVar55 = pNVar55 + 1;
        }
      }
    }
  } while ((uVar44 & 3) == 0);
  return local_8a0 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }